

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9VmThrowError(jx9_vm *pVm,SyString *pFuncName,sxi32 iErr,char *zMessage)

{
  SyBlob *pBlob;
  void *pvVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  ulong uVar4;
  char *pcVar5;
  char *zSrc;
  
  if (pVm->bErrReport != 0) {
    pBlob = &pVm->sWorker;
    SyBlobReset(pBlob);
    sVar2 = (pVm->aFiles).nUsed;
    if ((sVar2 != 0) && (pvVar1 = (pVm->aFiles).pBase, pvVar1 != (void *)0x0)) {
      uVar4 = (ulong)((sVar2 - 1) * (pVm->aFiles).eSize);
      SyBlobAppend(pBlob,*(void **)((long)pvVar1 + uVar4),*(sxu32 *)((long)pvVar1 + uVar4 + 8));
      SyBlobAppend(pBlob," ",1);
    }
    pcVar5 = "Error: ";
    if (iErr == 3) {
      pcVar5 = "Notice: ";
    }
    zSrc = "Warning: ";
    if (iErr != 2) {
      zSrc = pcVar5;
    }
    sVar2 = SyStrlen(zSrc);
    SyBlobAppend(pBlob,zSrc,sVar2);
    if (pFuncName != (SyString *)0x0) {
      SyBlobAppend(pBlob,pFuncName->zString,pFuncName->nByte);
      SyBlobAppend(pBlob,"(): ",4);
    }
    sVar2 = SyStrlen(zMessage);
    SyBlobAppend(pBlob,zMessage,sVar2);
    sVar3 = VmCallErrorHandler(pVm,pBlob);
    return sVar3;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmThrowError(
	jx9_vm *pVm,         /* Target VM */
	SyString *pFuncName, /* Function name. NULL otherwise */
	sxi32 iErr,          /* Severity level: [i.e: Error, Warning or Notice]*/
	const char *zMessage /* Null terminated error message */
	)
{
	SyBlob *pWorker = &pVm->sWorker;
	SyString *pFile;
	char *zErr;
	sxi32 rc;
	if( !pVm->bErrReport ){
		/* Don't bother reporting errors */
		return SXRET_OK;
	}
	/* Reset the working buffer */
	SyBlobReset(pWorker);
	/* Peek the processed file if available */
	pFile = (SyString *)SySetPeek(&pVm->aFiles);
	if( pFile ){
		/* Append file name */
		SyBlobAppend(pWorker, pFile->zString, pFile->nByte);
		SyBlobAppend(pWorker, (const void *)" ", sizeof(char));
	}
	zErr = "Error: ";
	switch(iErr){
	case JX9_CTX_WARNING: zErr = "Warning: "; break;
	case JX9_CTX_NOTICE:  zErr = "Notice: ";  break;
	default:
		iErr = JX9_CTX_ERR;
		break;
	}
	SyBlobAppend(pWorker, zErr, SyStrlen(zErr));
	if( pFuncName ){
		/* Append function name first */
		SyBlobAppend(pWorker, pFuncName->zString, pFuncName->nByte);
		SyBlobAppend(pWorker, "(): ", sizeof("(): ")-1);
	}
	SyBlobAppend(pWorker, zMessage, SyStrlen(zMessage));
	/* Consume the error message */
	rc = VmCallErrorHandler(&(*pVm), pWorker);
	return rc;
}